

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O1

bool __thiscall
ear::GainCalculatorDirectSpeakersImpl::_isLfeChannel
          (GainCalculatorDirectSpeakersImpl *this,DirectSpeakersTypeMetadata *metadata,
          WarningCB *warning_cb)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  pointer pbVar7;
  bool bVar8;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> speakerLabel;
  string nominalLabel;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  undefined1 local_c0 [24];
  long *local_a8;
  size_t local_a0;
  long local_98 [2];
  string local_88;
  _Any_data *local_68;
  DirectSpeakersTypeMetadata *local_60;
  GainCalculatorDirectSpeakersImpl *local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  bVar8 = (metadata->channelFrequency).lowPass.super_type.m_initialized;
  bVar6 = ((metadata->channelFrequency).highPass.super_type.m_initialized ^ 1U) & bVar8 &
          (metadata->channelFrequency).lowPass.super_type.m_storage <= 200.0;
  local_58 = this;
  if ((bVar6 == 0) &&
     ((bVar8 != false || ((metadata->channelFrequency).highPass.super_type.m_initialized == true))))
  {
    local_d0._0_4_ = FREQ_NOT_LFE;
    local_c8._M_p = local_c0 + 8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,
               "frequency indication present but does not indicate an LFE channel","");
    if ((warning_cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
      goto LAB_00161b01;
    }
    (*warning_cb->_M_invoker)((_Any_data *)warning_cb,(Warning *)local_d0);
    if (local_c8._M_p != local_c0 + 8) {
      operator_delete(local_c8._M_p,local_c0._8_8_ + 1);
    }
  }
  pbVar7 = (metadata->speakerLabels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (metadata->speakerLabels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = metadata;
  if (pbVar7 == pbVar1) {
    bVar5 = 0;
  }
  else {
    bVar5 = 0;
    local_68 = (_Any_data *)warning_cb;
    do {
      local_d0 = (undefined1  [8])local_c0;
      pcVar2 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d0,pcVar2,pcVar2 + pbVar7->_M_string_length);
      _nominalSpeakerLabel(&local_88,local_58,(string *)local_d0);
      local_a8 = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"LFE1","");
      if (local_88._M_string_length == local_a0) {
        if (local_88._M_string_length == 0) {
          bVar8 = true;
        }
        else {
          iVar3 = bcmp(local_88._M_dataplus._M_p,local_a8,local_88._M_string_length);
          bVar8 = iVar3 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      bVar9 = true;
      if (!bVar8) {
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"LFE2","");
        if (local_88._M_string_length == local_48) {
          if (local_88._M_string_length != 0) {
            iVar3 = bcmp(local_88._M_dataplus._M_p,local_50,local_88._M_string_length);
            bVar9 = iVar3 == 0;
          }
        }
        else {
          bVar9 = false;
        }
      }
      if ((!bVar8) && (local_50 != local_40)) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      if (bVar9) {
        bVar5 = 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 != (undefined1  [8])local_c0) {
        operator_delete((void *)local_d0,local_c0._0_8_ + 1);
      }
      pbVar7 = pbVar7 + 1;
      warning_cb = (WarningCB *)local_68;
    } while (pbVar7 != pbVar1);
  }
  if ((bVar6 != bVar5) &&
     ((local_60->speakerLabels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_60->speakerLabels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    local_d0._0_4_ = FREQ_SPEAKERLABEL_LFE_MISMATCH;
    local_c8._M_p = local_c0 + 8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,
               "LFE indication from frequency element does not match speakerLabel","");
    if (*(long *)((long)warning_cb + 0x10) == 0) {
LAB_00161b01:
      uVar4 = std::__throw_bad_function_call();
      _Unwind_Resume(uVar4);
    }
    (**(code **)((long)warning_cb + 0x18))((_Any_data *)warning_cb,(Warning *)local_d0);
    if (local_c8._M_p != local_c0 + 8) {
      operator_delete(local_c8._M_p,local_c0._8_8_ + 1);
    }
  }
  return (bool)(bVar6 | bVar5);
}

Assistant:

bool GainCalculatorDirectSpeakersImpl::_isLfeChannel(
      const DirectSpeakersTypeMetadata& metadata, const WarningCB& warning_cb) {
    bool has_lfe_freq = (metadata.channelFrequency.lowPass != boost::none &&
                         metadata.channelFrequency.lowPass.get() <= 200 &&
                         metadata.channelFrequency.highPass == boost::none);
    if (!has_lfe_freq && (metadata.channelFrequency.lowPass ||
                          metadata.channelFrequency.highPass))
      warning_cb({Warning::Code::FREQ_NOT_LFE,
                  "frequency indication present but does "
                  "not indicate an LFE channel"});

    bool has_lfe_name = false;
    for (auto speakerLabel : metadata.speakerLabels) {
      std::string nominalLabel = _nominalSpeakerLabel(speakerLabel);
      if (nominalLabel == std::string("LFE1") ||
          nominalLabel == std::string("LFE2")) {
        has_lfe_name = true;
      }
    }

    if (has_lfe_freq != has_lfe_name && metadata.speakerLabels.size())
      warning_cb({Warning::Code::FREQ_SPEAKERLABEL_LFE_MISMATCH,
                  "LFE indication from frequency element does not match "
                  "speakerLabel"});

    return has_lfe_freq || has_lfe_name;
  }